

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  FieldDescriptor *this_00;
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  CppType CVar4;
  LogMessage *other;
  TypeInfo *pTVar5;
  Descriptor *type;
  Message *pMVar6;
  int i;
  long lVar7;
  long lVar8;
  LogFinisher local_79;
  DynamicMessage *local_78;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  pTVar5 = this->type_info_;
  local_78 = this;
  if (pTVar5->prototype != (DynamicMessage *)0x0 && pTVar5->prototype != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
               ,0x240);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_68);
    pTVar5 = local_78->type_info_;
  }
  local_70 = pTVar5->factory;
  pDVar2 = pTVar5->type;
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(pDVar2 + 0x68); lVar7 = lVar7 + 1) {
    lVar3 = *(long *)(pDVar2 + 0x28);
    this_00 = (FieldDescriptor *)(lVar3 + lVar8);
    uVar1 = (local_78->type_info_->offsets)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar7];
    CVar4 = FieldDescriptor::cpp_type(this_00);
    if ((CVar4 == CPPTYPE_MESSAGE) && (*(int *)(lVar3 + 0x3c + lVar8) != 3)) {
      type = FieldDescriptor::message_type(this_00);
      pMVar6 = DynamicMessageFactory::GetPrototypeNoLock(local_70,type);
      *(Message **)
       ((long)&(local_78->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1) =
           pMVar6;
    }
    lVar8 = lVar8 + 0x98;
  }
  return;
}

Assistant:

inline bool is_prototype() const {
    return type_info_->prototype == this ||
           // If type_info_->prototype is NULL, then we must be constructing
           // the prototype now, which means we must be the prototype.
           type_info_->prototype == NULL;
  }